

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpticalFlowFrameToFrame.h
# Opt level: O1

void __thiscall
vo::OpticalFlowFrameToFrame<float,_vo::Pattern51>::trackPoints
          (OpticalFlowFrameToFrame<float,_vo::Pattern51> *this,
          ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *pyr_1,
          ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *pyr_2,
          aligned_map<KeypointId,_Eigen::AffineCompact2f> *transform_map_1,
          aligned_map<KeypointId,_Eigen::AffineCompact2f> *transform_map_2)

{
  size_type __n;
  _Base_ptr p_Var1;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>,std::_Select1st<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>,std::less<unsigned_long>,Eigen::aligned_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>
  *this_00;
  _Base_ptr p_Var2;
  long lVar3;
  _Rb_tree_header *p_Var4;
  aligned_vector<Eigen::AffineCompact2f> init_vec;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ids;
  blocked_range<unsigned_long> range;
  anon_class_48_6_1519dfa4 compute_func;
  concurrent_unordered_map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
  result;
  vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  local_338;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_318;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>,std::_Select1st<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>,std::less<unsigned_long>,Eigen::aligned_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>
  *local_2f8;
  OpticalFlowFrameToFrame<float,_vo::Pattern51> *local_2f0;
  ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *local_2e8;
  ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_> *local_2e0;
  solist_iterator<tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>,_std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>
  local_2d8;
  solist_iterator<tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>,_std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>
  local_2d0;
  blocked_range<unsigned_long> local_2c8;
  anon_class_48_6_1519dfa4 local_2b0;
  concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>
  local_280;
  
  __n = (transform_map_1->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_318.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_318.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_338.
  super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Transform<float,_2,_18,_0> *)0x0;
  local_338.
  super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Transform<float,_2,_18,_0> *)0x0;
  local_2f8 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>,std::_Select1st<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>,std::less<unsigned_long>,Eigen::aligned_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>
               *)transform_map_2;
  local_2f0 = this;
  local_2e8 = pyr_1;
  local_2e0 = pyr_2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_318,__n);
  std::
  vector<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
  ::reserve(&local_338,__n);
  p_Var2 = (transform_map_1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(transform_map_1->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    do {
      if (local_318.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_318.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_318,
                   (iterator)
                   local_318.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)(p_Var2 + 1));
      }
      else {
        *local_318.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = *(unsigned_long *)(p_Var2 + 1);
        local_318.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_318.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (local_338.
          super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_338.
          super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Transform<float,2,18,0>,Eigen::aligned_allocator<Eigen::Transform<float,2,18,0>>>
        ::_M_realloc_insert<Eigen::Transform<float,2,18,0>const&>
                  ((vector<Eigen::Transform<float,2,18,0>,Eigen::aligned_allocator<Eigen::Transform<float,2,18,0>>>
                    *)&local_338,
                   (iterator)
                   local_338.
                   super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (Transform<float,_2,_18,_0> *)&p_Var2[1]._M_parent);
      }
      else {
        *(_Base_ptr *)
         (((local_338.
            super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->m_matrix).
          super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.m_data.array + 4) =
             p_Var2[1]._M_right;
        p_Var1 = p_Var2[1]._M_left;
        *(_Base_ptr *)
         ((local_338.
           super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->m_matrix).
         super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.m_data.array =
             p_Var2[1]._M_parent;
        *(_Base_ptr *)
         (((local_338.
            super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->m_matrix).
          super_PlainObjectBase<Eigen::Matrix<float,_2,_3,_0,_2,_3>_>.m_storage.m_data.array + 2) =
             p_Var1;
        local_338.
        super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_338.
             super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  local_2d8.my_node_ptr = (node_ptr)&local_280.my_head;
  local_280.my_size.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_280.my_bucket_count.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)8;
  local_280.my_max_load_factor = 4.0;
  local_280.my_head.my_next._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_280.my_head.my_order_key = 0;
  local_280.my_segments.
  super_segment_table<std::atomic<tbb::detail::d1::list_node<unsigned_long>_*>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>::unordered_segment_table,_63UL>
  .segment_allocation_failure_tag = (segment_type)0x1;
  local_280.my_segments.
  super_segment_table<std::atomic<tbb::detail::d1::list_node<unsigned_long>_*>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>::unordered_segment_table,_63UL>
  .my_segment_table._M_b._M_p =
       (__base_type)
       ((long)&local_280.my_segments.
               super_segment_table<std::atomic<tbb::detail::d1::list_node<unsigned_long>_*>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>::unordered_segment_table,_63UL>
       + 0x18);
  local_280.my_segments.
  super_segment_table<std::atomic<tbb::detail::d1::list_node<unsigned_long>_*>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>::unordered_segment_table,_63UL>
  .my_first_block.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_280.my_segments.
  super_segment_table<std::atomic<tbb::detail::d1::list_node<unsigned_long>_*>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>::unordered_segment_table,_63UL>
  .my_size.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_280.my_segments.
  super_segment_table<std::atomic<tbb::detail::d1::list_node<unsigned_long>_*>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>::unordered_segment_table,_63UL>
  .my_segment_table_allocation_failed._M_base._M_i = (__atomic_base<bool>)false;
  lVar3 = 8;
  do {
    *(undefined8 *)
     ((long)&local_280.my_segments.
             super_segment_table<std::atomic<tbb::detail::d1::list_node<unsigned_long>_*>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>::unordered_segment_table,_63UL>
     + lVar3 * 8 + -0x28) = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x47);
  local_2b0.this = local_2f0;
  local_2b0.pyr_1 = local_2e8;
  local_2b0.pyr_2 = local_2e0;
  local_2b0.result =
       (concurrent_unordered_map<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
        *)&local_280;
  local_2c8.my_begin = 0;
  local_2c8.my_grainsize = 1;
  local_2c8.my_end = __n;
  local_2b0.ids = &local_318;
  local_2b0.init_vec = &local_338;
  tbb::detail::d1::
  start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/powei-lin[P]OpticalFlowTracker/include/optical_flow/OpticalFlowFrameToFrame.h:166:25),_const_tbb::detail::d1::auto_partitioner>
  ::run(&local_2c8,&local_2b0,(auto_partitioner *)&local_2d8);
  this_00 = local_2f8;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>,_std::_Select1st<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_std::less<unsigned_long>,_Eigen::aligned_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
  ::clear((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>,_std::_Select1st<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_std::less<unsigned_long>,_Eigen::aligned_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>_>
           *)local_2f8);
  do {
    if ((((local_2d8.my_node_ptr)->super_list_node<unsigned_long>).my_order_key & 1) != 0) break;
    local_2d8.my_node_ptr =
         (node_ptr)((local_2d8.my_node_ptr)->super_list_node<unsigned_long>).my_next._M_b._M_p;
  } while (local_2d8.my_node_ptr != (node_ptr)0x0);
  local_2d0.my_node_ptr = (node_ptr)0x0;
  std::
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>,std::_Select1st<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>,std::less<unsigned_long>,Eigen::aligned_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>
  ::
  _M_insert_range_unique<tbb::detail::d1::solist_iterator<tbb::detail::d1::concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,Eigen::Transform<float,2,18,0>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,tbb::detail::d1::tbb_allocator<std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>,false>>,std::pair<unsigned_long_const,Eigen::Transform<float,2,18,0>>>>
            (this_00,&local_2d8,&local_2d0);
  tbb::detail::d1::
  concurrent_unordered_base<tbb::detail::d1::concurrent_unordered_map_traits<unsigned_long,_Eigen::Transform<float,_2,_18,_0>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_tbb::detail::d1::tbb_allocator<std::pair<const_unsigned_long,_Eigen::Transform<float,_2,_18,_0>_>_>,_false>_>
  ::~concurrent_unordered_base(&local_280);
  if (local_338.
      super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free(local_338.
         super__Vector_base<Eigen::Transform<float,_2,_18,_0>,_Eigen::aligned_allocator<Eigen::Transform<float,_2,_18,_0>_>_>
         ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_318.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void trackPoints(const vo::ManagedImagePyr<u_int16_t>& pyr_1,
                   const vo::ManagedImagePyr<u_int16_t>& pyr_2,
                   const Eigen::aligned_map<KeypointId, Eigen::AffineCompact2f>&
                       transform_map_1,
                   Eigen::aligned_map<KeypointId, Eigen::AffineCompact2f>&
                       transform_map_2) const {
    size_t num_points = transform_map_1.size();

    std::vector<KeypointId> ids;
    Eigen::aligned_vector<Eigen::AffineCompact2f> init_vec;

    ids.reserve(num_points);
    init_vec.reserve(num_points);

    for (const auto& kv : transform_map_1) {
      ids.push_back(kv.first);
      init_vec.push_back(kv.second);
    }

    tbb::concurrent_unordered_map<KeypointId, Eigen::AffineCompact2f,
                                  std::hash<KeypointId>>
        result;

    auto compute_func = [&](const tbb::blocked_range<size_t>& range) {
      for (size_t r = range.begin(); r != range.end(); ++r) {
        const KeypointId id = ids[r];

        const Eigen::AffineCompact2f& transform_1 = init_vec[r];
        Eigen::AffineCompact2f transform_2 = transform_1;

        bool valid = trackPoint(pyr_1, pyr_2, transform_1, transform_2);

        if (valid) {
          Eigen::AffineCompact2f transform_1_recovered = transform_2;

          valid = trackPoint(pyr_2, pyr_1, transform_2, transform_1_recovered);

          if (valid) {
            Scalar dist2 = (transform_1.translation() -
                            transform_1_recovered.translation())
                               .squaredNorm();

            if (dist2 < optical_flow_max_recovered_dist2) {
              result[id] = transform_2;
            }
          }
        }
      }
    };

    tbb::blocked_range<size_t> range(0, num_points);

    tbb::parallel_for(range, compute_func);
    // compute_func(range);

    transform_map_2.clear();
    transform_map_2.insert(result.begin(), result.end());
  }